

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::QuadFillTest::QuadFillTest
          (QuadFillTest *this,Context *context,char *name,char *description,
          WindowRectangle *viewport,Vec3 *d1,Vec3 *d2,Vec3 *center_)

{
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  *this_00;
  int i;
  long lVar1;
  Vec4 center;
  Vec4 e2;
  Vec4 e1;
  float local_138 [8];
  undefined8 local_118;
  float local_110;
  undefined4 local_10c;
  float local_108 [8];
  undefined1 local_e8 [24];
  undefined1 *puStack_d0;
  float local_c8 [2];
  float afStack_c0 [2];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  float local_a8 [2];
  float afStack_a0 [2];
  undefined1 *local_98;
  undefined1 *puStack_90;
  value_type local_88;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,"polygon edge clipping");
  (this->super_TriangleFillTest).super_FillTest.super_RenderTestCase.super_TestCase.m_context =
       context;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.left = 0x32;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.bottom = 0x32;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.width = 100;
  (this->super_TriangleFillTest).super_FillTest.m_viewport.height = 100;
  this_00 = &(this->super_TriangleFillTest).m_triangles;
  (this->super_TriangleFillTest).m_triangles.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TriangleFillTest).m_triangles.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TriangleFillTest).m_triangles.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TriangleFillTest).super_FillTest.super_RenderTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TriangleFillTest_0216d538;
  local_118 = *(undefined8 *)d1->m_data;
  local_110 = d1->m_data[2];
  local_10c = 0x3f800000;
  local_e8._0_8_ = *(undefined8 *)description;
  local_e8._12_4_ = 0;
  local_e8._8_4_ = *(uint *)(description + 8);
  local_108[4] = 0.0;
  local_108[5] = 0.0;
  local_108[6] = 0.0;
  local_108[7] = 0.0;
  lVar1 = 0;
  do {
    local_108[lVar1 + 4] = *(float *)(local_e8 + lVar1 * 4) * 40000.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_e8._0_4_ = viewport->left;
  local_e8._4_4_ = viewport->bottom;
  local_e8._12_4_ = 0;
  local_e8._8_4_ = viewport->width;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  lVar1 = 0;
  do {
    local_108[lVar1] = *(float *)(local_e8 + lVar1 * 4) * 40000.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_e8._0_4_ = 0.0;
  local_e8._4_4_ = 0.0;
  local_e8._8_4_ = 0.0;
  local_e8._12_4_ = 0.0;
  local_88.c2.m_data[0] = 0.0;
  local_88.c2.m_data[1] = 0.0;
  local_88.c2.m_data[2] = 0.0;
  local_88.c2.m_data[3] = 0.0;
  local_88.v2.m_data[0] = 0.0;
  local_88.v2.m_data[1] = 0.0;
  local_88.v2.m_data[2] = 0.0;
  local_88.v2.m_data[3] = 0.0;
  local_88.c1.m_data[0] = 0.0;
  local_88.c1.m_data[1] = 0.0;
  local_88.c1.m_data[2] = 0.0;
  local_88.c1.m_data[3] = 0.0;
  local_88.v1.m_data[0] = 0.0;
  local_88.v1.m_data[1] = 0.0;
  local_88.v1.m_data[2] = 0.0;
  local_88.v1.m_data[3] = 0.0;
  local_88.c0.m_data[0] = 0.0;
  local_88.c0.m_data[1] = 0.0;
  local_88.c0.m_data[2] = 0.0;
  local_88.c0.m_data[3] = 0.0;
  local_88.v0.m_data[0] = 0.0;
  local_88.v0.m_data[1] = 0.0;
  local_88.v0.m_data[2] = 0.0;
  local_88.v0.m_data[3] = 0.0;
  local_e8._16_8_ = &DAT_3f0000003f000000;
  puStack_d0 = &DAT_3f0000003f000000;
  local_b8 = &DAT_3f0000003f000000;
  puStack_b0 = &DAT_3f0000003f000000;
  local_98 = &DAT_3f0000003f000000;
  puStack_90 = &DAT_3f0000003f000000;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1] = *(float *)((long)&local_118 + lVar1 * 4) + local_108[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1 + 4] = local_138[lVar1] + local_108[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_e8._0_4_ = local_138[4];
  local_e8._4_4_ = local_138[5];
  local_e8._8_4_ = local_138[6];
  local_e8._12_4_ = local_138[7];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1] = *(float *)((long)&local_118 + lVar1 * 4) + local_108[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1 + 4] = local_138[lVar1] - local_108[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_c8[0] = local_138[4];
  local_c8[1] = local_138[5];
  afStack_c0[0] = local_138[6];
  afStack_c0[1] = local_138[7];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1] = *(float *)((long)&local_118 + lVar1 * 4) - local_108[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1 + 4] = local_138[lVar1] - local_108[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_a8[0] = local_138[4];
  local_a8[1] = local_138[5];
  afStack_a0[0] = local_138[6];
  afStack_a0[1] = local_138[7];
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(this_00,(value_type *)local_e8);
  local_88.c0.m_data[0] = 0.5;
  local_88.c0.m_data[1] = 0.0;
  local_88.c0.m_data[2] = 0.0;
  local_88.c0.m_data[3] = 0.5;
  local_88.c1.m_data[0] = 0.5;
  local_88.c1.m_data[1] = 0.0;
  local_88.c1.m_data[2] = 0.0;
  local_88.c1.m_data[3] = 0.5;
  local_88.c2.m_data[0] = 0.5;
  local_88.c2.m_data[1] = 0.0;
  local_88.c2.m_data[2] = 0.0;
  local_88.c2.m_data[3] = 0.5;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1] = *(float *)((long)&local_118 + lVar1 * 4) + local_108[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1 + 4] = local_138[lVar1] + local_108[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_88.v0.m_data[0] = local_138[4];
  local_88.v0.m_data[1] = local_138[5];
  local_88.v0.m_data[2] = local_138[6];
  local_88.v0.m_data[3] = local_138[7];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1] = *(float *)((long)&local_118 + lVar1 * 4) - local_108[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1 + 4] = local_138[lVar1] - local_108[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_88.v1.m_data[0] = local_138[4];
  local_88.v1.m_data[1] = local_138[5];
  local_88.v1.m_data[2] = local_138[6];
  local_88.v1.m_data[3] = local_138[7];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1] = *(float *)((long)&local_118 + lVar1 * 4) - local_108[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  lVar1 = 0;
  do {
    local_138[lVar1 + 4] = local_138[lVar1] + local_108[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_88.v2.m_data[0] = local_138[4];
  local_88.v2.m_data[1] = local_138[5];
  local_88.v2.m_data[2] = local_138[6];
  local_88.v2.m_data[3] = local_138[7];
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(this_00,&local_88);
  return;
}

Assistant:

QuadFillTest::QuadFillTest (Context& context, const char* name, const char* description, const rr::WindowRectangle& viewport, const tcu::Vec3& d1, const tcu::Vec3& d2, const tcu::Vec3& center_)
	: TriangleFillTest(context, name, description, viewport)
{
	const float		radius		= 40000.0f;
	const tcu::Vec4 center		= tcu::Vec4(center_.x(), center_.y(), center_.z(), 1.0f);
	const tcu::Vec4 halfWhite	= tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
	const tcu::Vec4 halfRed		= tcu::Vec4(0.5f, 0.0f, 0.0f, 0.5f);
	const tcu::Vec4	e1			= radius * tcu::Vec4(d1.x(), d1.y(), d1.z(), 0.0f);
	const tcu::Vec4	e2			= radius * tcu::Vec4(d2.x(), d2.y(), d2.z(), 0.0f);

	FillTriangle triangle1;
	FillTriangle triangle2;

	triangle1.c0 = halfWhite;
	triangle1.c1 = halfWhite;
	triangle1.c2 = halfWhite;
	triangle1.v0 = center + e1 + e2;
	triangle1.v1 = center + e1 - e2;
	triangle1.v2 = center - e1 - e2;
	m_triangles.push_back(triangle1);

	triangle2.c0 = halfRed;
	triangle2.c1 = halfRed;
	triangle2.c2 = halfRed;
	triangle2.v0 = center + e1 + e2;
	triangle2.v1 = center - e1 - e2;
	triangle2.v2 = center - e1 + e2;
	m_triangles.push_back(triangle2);
}